

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O0

void __thiscall
cmForEachFunctionBlocker::cmForEachFunctionBlocker(cmForEachFunctionBlocker *this,cmMakefile *mf)

{
  cmMakefile *mf_local;
  cmForEachFunctionBlocker *this_local;
  
  cmFunctionBlocker::cmFunctionBlocker(&this->super_cmFunctionBlocker);
  (this->super_cmFunctionBlocker)._vptr_cmFunctionBlocker =
       (_func_int **)&PTR_IsFunctionBlocked_00bf2308;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Args);
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::vector(&this->Functions);
  this->Makefile = mf;
  this->Depth = 0;
  cmMakefile::PushLoopBlock(this->Makefile);
  return;
}

Assistant:

cmForEachFunctionBlocker::cmForEachFunctionBlocker(cmMakefile* mf)
  : Makefile(mf)
  , Depth(0)
{
  this->Makefile->PushLoopBlock();
}